

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::assignCompressedObjectNumbers(QPDFWriter *this,QPDFObjGen og)

{
  int iVar1;
  QPDFObjGen *pQVar2;
  element_type *peVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  Object *pOVar6;
  QPDFObjGen *iter;
  QPDFObjGen *pQVar7;
  int objid;
  key_type local_24;
  
  if ((ulong)og >> 0x20 == 0) {
    sVar4 = std::
            map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
            ::count(&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->object_stream_to_objects,&local_24);
    if (sVar4 != 0) {
      pmVar5 = std::
               map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->object_stream_to_objects,&local_24);
      pQVar2 = (pmVar5->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pQVar7 = (pmVar5->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
                    super__Vector_impl_data._M_start; pQVar7 != pQVar2; pQVar7 = pQVar7 + 1) {
        peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar1 = peVar3->next_objid;
        peVar3->next_objid = iVar1 + 1;
        pOVar6 = ObjTable<QPDFWriter::Object>::operator[]
                           (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,*pQVar7);
        pOVar6->renumber = iVar1;
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::assignCompressedObjectNumbers(QPDFObjGen og)
{
    int objid = og.getObj();
    if ((og.getGen() != 0) || (m->object_stream_to_objects.count(objid) == 0)) {
        // This is not an object stream.
        return;
    }

    // Reserve numbers for the objects that belong to this object stream.
    for (auto const& iter: m->object_stream_to_objects[objid]) {
        m->obj[iter].renumber = m->next_objid++;
    }
}